

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O0

void DrawerCommandQueue::
     QueueCommand<swrenderer::DrawSlabPalCommand,int&,int&,int&,int&,unsigned_char_const*&,unsigned_char*&,unsigned_char_const*&>
               (int *args,int *args_1,int *args_2,int *args_3,uchar **args_4,uchar **args_5,
               uchar **args_6)

{
  DrawSlabPalCommand *pDVar1;
  bool bVar2;
  _func_void_void_ptr *tryBlock;
  _func_void_void_ptr_char_ptr_bool *catchBlock;
  DrawSlabPalCommand *local_108;
  DrawSlabPalCommand *local_100;
  DrawSlabPalCommand *command_1;
  void *ptr;
  _lambda_void__char_const__bool__1_ local_da;
  _lambda_void___1_ local_d9;
  undefined1 local_d8 [8];
  DrawSlabPalCommand command;
  DrawerCommandQueue *queue;
  uchar **args_local_5;
  uchar **args_local_4;
  int *args_local_3;
  int *args_local_2;
  int *args_local_1;
  int *args_local;
  
  command._144_8_ = Instance();
  if ((((DrawerCommandQueue *)command._144_8_)->threaded_render == 0) ||
     (bVar2 = FBoolCVar::operator_cast_to_bool(&r_multithreaded), !bVar2)) {
    swrenderer::DrawSlabPalCommand::DrawSlabPalCommand
              ((DrawSlabPalCommand *)local_d8,*args,*args_1,*args_2,*args_3,*args_4,*args_5,*args_6)
    ;
    tryBlock = QueueCommand(int&,int&,int&,int&,unsigned_char_const*&,unsigned_char*&,unsigned_char_const*&)
               ::{lambda(void*)#1}::operator_cast_to_function_pointer(&local_d9);
    catchBlock = QueueCommand(int&,int&,int&,int&,unsigned_char_const*&,unsigned_char*&,unsigned_char_const*&)
                 ::{lambda(void*,char_const*,bool)#1}::operator_cast_to_function_pointer(&local_da);
    VectoredTryCatch((DrawSlabPalCommand *)local_d8,tryBlock,catchBlock);
    swrenderer::DrawSlabPalCommand::~DrawSlabPalCommand((DrawSlabPalCommand *)local_d8);
  }
  else {
    command_1 = (DrawSlabPalCommand *)AllocMemory(0x98);
    if (command_1 == (DrawSlabPalCommand *)0x0) {
      Finish((DrawerCommandQueue *)command._144_8_);
      command_1 = (DrawSlabPalCommand *)AllocMemory(0x98);
      if (command_1 == (DrawSlabPalCommand *)0x0) {
        return;
      }
    }
    pDVar1 = command_1;
    swrenderer::DrawSlabPalCommand::DrawSlabPalCommand
              (command_1,*args,*args_1,*args_2,*args_3,*args_4,*args_5,*args_6);
    local_100 = pDVar1;
    local_108 = pDVar1;
    std::vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>::push_back
              ((vector<DrawerCommand_*,_std::allocator<DrawerCommand_*>_> *)
               (Instance::queue.memorypool + command._144_8_ + 0x599518),(value_type *)&local_108);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}